

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

vm_obj_id_t
CVmDynamicFunc::create
          (int in_root_set,vm_obj_id_t globals,vm_obj_id_t locals,vm_obj_id_t macros,
          vm_val_t *srcval,char *src,size_t src_len)

{
  vm_obj_id_t vVar1;
  CVmDynamicCompiler *this;
  CVmDynCompResults local_48;
  
  this = CVmDynamicCompiler::get();
  local_48._vptr_CVmDynCompResults = (_func_int **)&PTR__CVmDynCompResults_003201d0;
  local_48.err = 0;
  local_48.msgbuf = (char *)0x0;
  vVar1 = CVmDynamicCompiler::compile
                    (this,in_root_set,globals,locals,macros,srcval,src,src_len,DCModeAuto,
                     (CVmDynCompDebug *)0x0,&local_48);
  if (vVar1 == 0) {
    CVmDynCompResults::throw_error(&local_48);
  }
  local_48._vptr_CVmDynCompResults = (_func_int **)&PTR__CVmDynCompResults_003201d0;
  if (local_48.msgbuf != (char *)0x0) {
    free(local_48.msgbuf);
  }
  return vVar1;
}

Assistant:

vm_obj_id_t CVmDynamicFunc::create(VMG_ int in_root_set,
                                   vm_obj_id_t globals,
                                   vm_obj_id_t locals,
                                   vm_obj_id_t macros,
                                   const vm_val_t *srcval,
                                   const char *src, size_t src_len)
{
    /* get the compiler interface */
    CVmDynamicCompiler *comp = CVmDynamicCompiler::get(vmg0_);

    /* compile the code and create a code object */
    CVmDynCompResults results;
    vm_obj_id_t id = comp->compile(
        vmg_ in_root_set, globals, locals, macros,
        srcval, src, src_len, DCModeAuto, 0, &results);

    /* if an error occurred, throw the error */
    if (id == VM_INVALID_OBJ)
        results.throw_error(vmg0_);

    /* return the new ID */
    return id;
}